

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.cpp
# Opt level: O1

set<int,_std::less<int>,_std::allocator<int>_> * __thiscall
glu::GetCompressedTextureFormats::operator()
          (set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,
          GetCompressedTextureFormats *this,RenderContext *context)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  _Iter in_R8;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> __result;
  vector<int,_std::allocator<int>_> formats;
  int numFormats;
  allocator_type local_39;
  vector<int,_std::allocator<int>_> local_38;
  int local_1c;
  long lVar3;
  
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  lVar3 = CONCAT44(extraout_var,iVar2);
  local_1c = 0;
  (**(code **)(lVar3 + 0x868))(0x86a2,&local_1c);
  std::vector<int,_std::allocator<int>_>::vector(&local_38,(long)local_1c,&local_39);
  if (0 < local_1c) {
    (**(code **)(lVar3 + 0x868))
              (0x86a3,local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
  }
  err = (**(code **)(lVar3 + 0x800))();
  checkError(err,"glGetIntegerv(GL_COMPRESSED_TEXTURE_FORMATS) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluContextInfo.cpp"
             ,0xaf);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  __result.iter._M_node = in_R8._M_node;
  __result.container = (set<int,_std::less<int>,_std::allocator<int>_> *)p_Var1;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<int*,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>>
            ((__copy_move<false,false,std::random_access_iterator_tag> *)
             local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,(int *)__return_storage_ptr__,__result);
  if ((__copy_move<false,false,std::random_access_iterator_tag> *)
      local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (__copy_move<false,false,std::random_access_iterator_tag> *)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

set<int> GetCompressedTextureFormats::operator() (const RenderContext& context) const
{
	const glw::Functions& gl = context.getFunctions();

	int numFormats = 0;
	gl.getIntegerv(GL_NUM_COMPRESSED_TEXTURE_FORMATS, &numFormats);

	vector<int> formats(numFormats);
	if (numFormats > 0)
		gl.getIntegerv(GL_COMPRESSED_TEXTURE_FORMATS, &formats[0]);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv(GL_COMPRESSED_TEXTURE_FORMATS) failed");

	set<int> formatSet;
	std::copy(formats.begin(), formats.end(), std::inserter(formatSet, formatSet.begin()));

	return formatSet;
}